

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O1

bool __thiscall
glslang::TGlslIoMapper::doMap(TGlslIoMapper *this,TIoMapResolver *resolver,TInfoSink *infoSink)

{
  bool *hadError;
  TVarLiveMap **uniform;
  _Rb_tree_color _Var1;
  TVarLiveMap *pTVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar3;
  pointer pcVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *this_00;
  TIntermediate *pTVar5;
  TVarLiveMap *pTVar6;
  TVarLiveMap *pTVar7;
  TIntermNode *pTVar8;
  _Base_ptr p_Var9;
  void *pvVar10;
  undefined2 uVar11;
  undefined2 uVar12;
  undefined6 uVar13;
  undefined6 uVar14;
  bool bVar15;
  int iVar16;
  _Base_ptr p_Var17;
  ulong uVar18;
  _Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *p_Var19;
  _Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *p_Var20;
  iterator iVar21;
  _Rb_tree_node_base *p_Var22;
  TType *type;
  undefined4 extraout_var;
  long lVar23;
  byte bVar24;
  TVarLivePair *var_4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  *ppVar25;
  TVarLiveMap **ppTVar26;
  TVarLiveMap **ppTVar27;
  int stage;
  EShLanguage EVar28;
  pointer pTVar29;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __i;
  _Rb_tree_header *p_Var30;
  pointer pTVar31;
  pointer pTVar32;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_01;
  __normal_iterator<glslang::TVarLivePair_*,_std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>_>
  __i_2;
  long lVar33;
  undefined1 auVar34 [16];
  TVarLiveVector *__range4_1;
  TVarLiveVector uniformVector;
  TVarLiveVector *__range4;
  int stride;
  int size;
  undefined2 local_5d8;
  undefined6 uStack_5d6;
  undefined2 uStack_5d0;
  undefined2 local_5ce;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_11
  local_5c8;
  _Base_ptr local_5b8;
  TIntermSymbol *pTStack_5b0;
  undefined8 local_5a8;
  _Base_ptr p_Stack_5a0;
  _Base_ptr local_598;
  TIntermediate *pTStack_590;
  undefined1 local_588 [16];
  undefined1 local_578 [16];
  float local_568;
  undefined1 local_560 [16];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  float local_530;
  undefined1 local_528 [16];
  undefined1 local_518;
  TVarLiveMap *local_510;
  TVarLiveMap *local_508;
  TVarLiveMap *local_500;
  TResolverInOutAdaptor inOutResolve;
  TResolverUniformAdaptor uniformResolve;
  TVarLiveVector outVectors [14];
  TVarLiveVector inVectors [14];
  TSymbolValidater symbolValidater;
  
  bVar24 = 0;
  (*resolver->_vptr_TIoMapResolver[0xf])(resolver,0xe);
  if (this->hadError == false) {
    hadError = &this->hadError;
    uniform = this->uniformVarMap;
    uniformResolve.stage = EShLangCount;
    ppTVar26 = uniform;
    ppTVar27 = uniformResolve.uniformVarMap;
    for (lVar23 = 0xe; lVar23 != 0; lVar23 = lVar23 + -1) {
      *ppTVar27 = *ppTVar26;
      ppTVar26 = ppTVar26 + (ulong)bVar24 * -2 + 1;
      ppTVar27 = ppTVar27 + (ulong)bVar24 * -2 + 1;
    }
    inOutResolve.stage = EShLangCount;
    ppTVar26 = this->inVarMaps;
    ppTVar27 = this->outVarMaps;
    inOutResolve.resolver = resolver;
    inOutResolve.infoSink = infoSink;
    inOutResolve.error = hadError;
    uniformResolve.resolver = resolver;
    uniformResolve.infoSink = infoSink;
    uniformResolve.error = hadError;
    TSymbolValidater::TSymbolValidater
              (&symbolValidater,resolver,infoSink,ppTVar26,ppTVar27,uniform,hadError,this->profile,
               this->version);
    lVar23 = 0;
    memset(inVectors,0,0x150);
    memset(outVectors,0,0x150);
    uniformVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    uniformVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    uniformVector.super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (*resolver->_vptr_TIoMapResolver[0xe])(resolver,0xe);
    do {
      uVar13 = uStack_5d6;
      uVar11 = local_5d8;
      pTVar2 = ppTVar26[lVar23];
      EVar28 = (EShLanguage)lVar23;
      local_5d8 = SUB82(&local_5c8,0);
      uVar12 = local_5d8;
      uStack_5d6 = (undefined6)((ulong)&local_5c8 >> 0x10);
      uVar14 = uStack_5d6;
      local_5d8 = uVar11;
      uStack_5d6 = uVar13;
      if (pTVar2 != (TVarLiveMap *)0x0) {
        p_Var17 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var30 = &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
        inOutResolve.stage = EVar28;
        if ((_Rb_tree_header *)p_Var17 != p_Var30) {
          do {
            _size = (undefined **)GetThreadPoolAllocator();
            local_5d8 = uVar12;
            uStack_5d6 = uVar14;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)&size,p_Var17[1]._M_parent,
                                (long)&(p_Var17[1]._M_left)->_M_color + (long)p_Var17[1]._M_parent);
            local_5b8 = p_Var17[2]._M_parent;
            pTStack_5b0 = (TIntermSymbol *)p_Var17[2]._M_left;
            local_5a8 = p_Var17[2]._M_right;
            p_Stack_5a0 = *(_Base_ptr *)(p_Var17 + 3);
            local_598 = p_Var17[3]._M_parent;
            pTStack_590 = (TIntermediate *)p_Var17[3]._M_left;
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       &inVectors[lVar23].
                        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ,(value_type *)&size);
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
          } while ((_Rb_tree_header *)p_Var17 != p_Var30);
        }
        pTVar32 = inVectors[lVar23].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar29 = inVectors[lVar23].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pTVar32 != pTVar29) {
          uVar18 = ((long)pTVar29 - (long)pTVar32 >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar33 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> lVar33 == 0; lVar33 = lVar33 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                    (pTVar32,pTVar29,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)pTVar29 - (long)pTVar32 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                      (pTVar32,pTVar29);
          }
          else {
            pTVar31 = pTVar32 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                      (pTVar32,pTVar31);
            for (; pTVar31 != pTVar29; pTVar31 = pTVar31 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__1>>
                        (pTVar31);
            }
          }
        }
        p_Var17 = (ppTVar27[lVar23]->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        p_Var30 = &(ppTVar27[lVar23]->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var17 != p_Var30) {
          do {
            _size = (undefined **)GetThreadPoolAllocator();
            local_5d8 = uVar12;
            uStack_5d6 = uVar14;
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                                 *)&size,p_Var17[1]._M_parent,
                                (long)&(p_Var17[1]._M_left)->_M_color + (long)p_Var17[1]._M_parent);
            local_5b8 = p_Var17[2]._M_parent;
            pTStack_5b0 = (TIntermSymbol *)p_Var17[2]._M_left;
            local_5a8 = p_Var17[2]._M_right;
            p_Stack_5a0 = *(_Base_ptr *)(p_Var17 + 3);
            local_598 = p_Var17[3]._M_parent;
            pTStack_590 = (TIntermediate *)p_Var17[3]._M_left;
            std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::push_back
                      ((vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_> *)
                       &outVectors[lVar23].
                        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ,(value_type *)&size);
            p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17);
          } while ((_Rb_tree_header *)p_Var17 != p_Var30);
        }
        pTVar32 = outVectors[lVar23].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pTVar29 = outVectors[lVar23].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (pTVar32 != pTVar29) {
          uVar18 = ((long)pTVar29 - (long)pTVar32 >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar33 = 0x3f;
          if (uVar18 != 0) {
            for (; uVar18 >> lVar33 == 0; lVar33 = lVar33 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                    (pTVar32,pTVar29,((uint)lVar33 ^ 0x3f) * 2 ^ 0x7e);
          if ((long)pTVar29 - (long)pTVar32 < 0x581) {
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                      (pTVar32,pTVar29);
          }
          else {
            pTVar31 = pTVar32 + 0x10;
            std::
            __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                      (pTVar32,pTVar31);
            for (; pTVar31 != pTVar29; pTVar31 = pTVar31 + 1) {
              std::
              __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__3>>
                        (pTVar31);
            }
          }
        }
        p_Var19 = &inVectors[lVar23].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
        ;
        ppVar3 = &(inVectors[lVar23].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar25 = &((p_Var19->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar25 != ppVar3; ppVar25 = ppVar25 + 1) {
          TSymbolValidater::operator()(&symbolValidater,ppVar25);
        }
        ppVar3 = &(inVectors[lVar23].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar25 = &((p_Var19->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar25 != ppVar3; ppVar25 = ppVar25 + 1) {
          TResolverInOutAdaptor::operator()(&inOutResolve,ppVar25);
        }
        p_Var20 = &outVectors[lVar23].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
        ;
        ppVar3 = &(outVectors[lVar23].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar25 = &((p_Var20->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar25 != ppVar3; ppVar25 = ppVar25 + 1) {
          TSymbolValidater::operator()(&symbolValidater,ppVar25);
        }
        ppVar3 = &(outVectors[lVar23].
                   super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ;
        for (ppVar25 = &((p_Var20->_M_impl).super__Vector_impl_data._M_start)->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
            ; ppVar25 != ppVar3; ppVar25 = ppVar25 + 1) {
          TResolverInOutAdaptor::operator()(&inOutResolve,ppVar25);
        }
        pTVar29 = inVectors[lVar23].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar32 = (p_Var19->_M_impl).super__Vector_impl_data._M_start; pTVar32 != pTVar29;
            pTVar32 = pTVar32 + 1) {
          _size = (undefined **)GetThreadPoolAllocator();
          pcVar4 = (pTVar32->
                   super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                   ).first._M_dataplus._M_p;
          local_5d8 = uVar12;
          uStack_5d6 = uVar14;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&size,pcVar4,
                              pcVar4 + (pTVar32->
                                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                                       ).first._M_string_length);
          local_5b8 = (_Base_ptr)
                      (pTVar32->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                      ).second.id;
          pTStack_5b0 = (pTVar32->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.symbol;
          local_5a8 = *(_Base_ptr *)
                       &(pTVar32->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.live;
          p_Stack_5a0 = *(_Base_ptr *)
                         &(pTVar32->
                          super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                          ).second.newBinding;
          local_598 = *(_Base_ptr *)
                       &(pTVar32->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.newLocation;
          pTStack_590 = *(TIntermediate **)
                         &(pTVar32->
                          super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                          ).second.newIndex;
          iVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(&ppTVar26[lVar23]->_M_t,(key_type *)&size);
          if ((_Rb_tree_header *)iVar21._M_node !=
              &(ppTVar26[lVar23]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar21._M_node[3]._M_parent = local_598;
            iVar21._M_node[3]._M_left = (_Base_ptr)pTStack_590;
            iVar21._M_node[2]._M_right = local_5a8;
            *(_Base_ptr *)(iVar21._M_node + 3) = p_Stack_5a0;
            iVar21._M_node[2]._M_parent = local_5b8;
            iVar21._M_node[2]._M_left = (_Base_ptr)pTStack_5b0;
          }
        }
        pTVar29 = outVectors[lVar23].
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar32 = (p_Var20->_M_impl).super__Vector_impl_data._M_start; pTVar32 != pTVar29;
            pTVar32 = pTVar32 + 1) {
          _size = (undefined **)GetThreadPoolAllocator();
          pcVar4 = (pTVar32->
                   super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                   ).first._M_dataplus._M_p;
          local_5d8 = uVar12;
          uStack_5d6 = uVar14;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&size,pcVar4,
                              pcVar4 + (pTVar32->
                                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                                       ).first._M_string_length);
          local_5b8 = (_Base_ptr)
                      (pTVar32->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                      ).second.id;
          pTStack_5b0 = (pTVar32->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.symbol;
          local_5a8 = *(_Base_ptr *)
                       &(pTVar32->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.live;
          p_Stack_5a0 = *(_Base_ptr *)
                         &(pTVar32->
                          super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                          ).second.newBinding;
          local_598 = *(_Base_ptr *)
                       &(pTVar32->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.newLocation;
          pTStack_590 = *(TIntermediate **)
                         &(pTVar32->
                          super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                          ).second.newIndex;
          iVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(&ppTVar27[lVar23]->_M_t,(key_type *)&size);
          if ((_Rb_tree_header *)iVar21._M_node !=
              &(ppTVar27[lVar23]->_M_t)._M_impl.super__Rb_tree_header) {
            iVar21._M_node[3]._M_parent = local_598;
            iVar21._M_node[3]._M_left = (_Base_ptr)pTStack_590;
            iVar21._M_node[2]._M_right = local_5a8;
            *(_Base_ptr *)(iVar21._M_node + 3) = p_Stack_5a0;
            iVar21._M_node[2]._M_parent = local_5b8;
            iVar21._M_node[2]._M_left = (_Base_ptr)pTStack_5b0;
          }
        }
      }
      pTVar2 = uniform[lVar23];
      if (pTVar2 != (TVarLiveMap *)0x0) {
        uniformResolve.stage = EVar28;
        for (p_Var22 = (pTVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var22 != &(pTVar2->_M_t)._M_impl.super__Rb_tree_header;
            p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22)) {
          _size = (undefined **)GetThreadPoolAllocator();
          local_5d8 = uVar12;
          uStack_5d6 = uVar14;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&size,p_Var22[1]._M_parent,
                              (long)&(p_Var22[1]._M_left)->_M_color + (long)p_Var22[1]._M_parent);
          local_5b8 = p_Var22[2]._M_parent;
          pTStack_5b0 = (TIntermSymbol *)p_Var22[2]._M_left;
          local_5a8 = p_Var22[2]._M_right;
          p_Stack_5a0 = *(_Base_ptr *)(p_Var22 + 3);
          local_598 = p_Var22[3]._M_parent;
          pTStack_590 = (TIntermediate *)p_Var22[3]._M_left;
          std::vector<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>::
          emplace_back<glslang::TVarLivePair>(&uniformVector,(TVarLivePair *)&size);
        }
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0xe);
    pTVar32 = uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar29 = uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar33 = (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (lVar33 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar23 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                (uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar33 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                  (pTVar32,pTVar29);
      }
      else {
        pTVar31 = pTVar32 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                  (pTVar32,pTVar31);
        for (; pTVar31 != pTVar29; pTVar31 = pTVar31 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__6>>
                    (pTVar31);
        }
      }
    }
    pTVar32 = uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppVar25 = &(uniformVector.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_start)->
                 super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
      ;
      do {
        TSymbolValidater::operator()(&symbolValidater,ppVar25);
        ppVar25 = ppVar25 + 1;
      } while (ppVar25 !=
               &pTVar32->
                super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
              );
    }
    pTVar32 = uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppVar25 = &(uniformVector.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_start)->
                 super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
      ;
      do {
        TResolverUniformAdaptor::operator()(&uniformResolve,ppVar25);
        ppVar25 = ppVar25 + 1;
      } while (ppVar25 !=
               &pTVar32->
                super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
              );
    }
    pTVar32 = uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pTVar29 = uniformVector.
              super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start !=
        uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar33 = (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)uniformVector.
                     super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar18 = (lVar33 >> 3) * 0x2e8ba2e8ba2e8ba3;
      lVar23 = 0x3f;
      if (uVar18 != 0) {
        for (; uVar18 >> lVar23 == 0; lVar23 = lVar23 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                (uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 uniformVector.
                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                 _M_impl.super__Vector_impl_data._M_finish,((uint)lVar23 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar33 < 0x581) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                  (pTVar32,pTVar29);
      }
      else {
        pTVar31 = pTVar32 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Iter_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                  (pTVar32,pTVar31);
        for (; pTVar31 != pTVar29; pTVar31 = pTVar31 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<glslang::TVarLivePair*,std::vector<glslang::TVarLivePair,std::allocator<glslang::TVarLivePair>>>,__gnu_cxx::__ops::_Val_comp_iter<glslang::TGlslIoMapper::doMap(glslang::TIoMapResolver*,TInfoSink&)::__7>>
                    (pTVar31);
        }
      }
    }
    (*resolver->_vptr_TIoMapResolver[0xf])(resolver,0xe);
    if ((this->autoPushConstantBlockName)._M_string_length != 0) {
      bVar15 = false;
      lVar23 = 0;
      do {
        if (((this->intermediates[lVar23] != (TIntermediate *)0x0) &&
            (iVar21 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                      ::find(&uniformResolve.uniformVarMap[lVar23]->_M_t,
                             &this->autoPushConstantBlockName),
            (_Rb_tree_header *)iVar21._M_node !=
            &(uniformResolve.uniformVarMap[lVar23]->_M_t)._M_impl.super__Rb_tree_header)) &&
           (lVar33 = (**(code **)(*(long *)iVar21._M_node[2]._M_left + 0x108))(),
           (*(uint *)(lVar33 + 8) & 0x7f) == 5)) {
          type = (TType *)(**(code **)(*(long *)iVar21._M_node[2]._M_left + 0xf8))();
          TIntermediate::getBaseAlignment
                    (type,&size,&stride,this->autoPushConstantBlockPacking,
                     (uint)((ulong)*(undefined8 *)(lVar33 + 8) >> 0x3d) == 1);
          if (size <= (int)this->autoPushConstantMaxSize) {
            *(undefined1 *)(lVar33 + 0x2d) = 1;
            *(ulong *)(lVar33 + 8) = *(ulong *)(lVar33 + 8) & 0xffffffffffffff80 | 5;
            uVar18 = *(ulong *)(lVar33 + 0x1c) & 0xffff0000ffc07fff | 0xffff001f8000;
            *(ulong *)(lVar33 + 0x1c) = uVar18;
            *(undefined1 *)(lVar33 + 0x10) =
                 *(byte *)(lVar33 + 0x10) & 0xf0 | (char)this->autoPushConstantBlockPacking & 0xf;
            *(ulong *)(lVar33 + 0x1c) = uVar18;
            *(undefined4 *)((long)&iVar21._M_node[2]._M_right + 4) = 0;
            auVar34._8_4_ = 0xffffffff;
            auVar34._0_8_ = 0xffffffffffffffff;
            auVar34._12_4_ = 0xffffffff;
            iVar21._M_node[3]._M_color = (int)0xffffffffffffffff;
            *(int *)&iVar21._M_node[3].field_0x4 = (int)(0xffffffffffffffff >> 0x20);
            iVar21._M_node[3]._M_parent = (_Base_ptr)auVar34._8_8_;
            *(undefined4 *)&iVar21._M_node[3]._M_left = 0xffffffff;
            bVar15 = true;
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0xe);
      if (bVar15) {
        pTVar32 = uniformVector.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )uniformVector.
                        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            this_01 !=
            (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)pTVar32;
            this_01 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      &this_01[2]._M_dataplus._M_p) {
          iVar16 = std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                   compare(this_01,&this->autoPushConstantBlockName);
          if (iVar16 == 0) {
            *(TLayoutPacking *)((long)&this_01[1]._M_string_length + 4) =
                 this->autoPushConstantBlockPacking;
            *(undefined4 *)((long)&this_01[1].field_2 + 4) = 0x3f;
          }
        }
      }
    }
    lVar23 = 0;
    do {
      if (this->intermediates[lVar23] != (TIntermediate *)0x0) {
        pTVar32 = uniformVector.
                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (pTVar29 = uniformVector.
                       super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                       ._M_impl.super__Vector_impl_data._M_start; pTVar29 != pTVar32;
            pTVar29 = pTVar29 + 1) {
          _size = (undefined **)GetThreadPoolAllocator();
          pcVar4 = (pTVar29->
                   super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                   ).first._M_dataplus._M_p;
          local_5d8 = uVar12;
          uStack_5d6 = uVar14;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>
                               *)&size,pcVar4,
                              pcVar4 + (pTVar29->
                                       super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                                       ).first._M_string_length);
          local_5b8 = (_Base_ptr)
                      (pTVar29->
                      super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                      ).second.id;
          pTStack_5b0 = (pTVar29->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.symbol;
          local_5a8 = *(_Base_ptr *)
                       &(pTVar29->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.live;
          p_Stack_5a0 = *(_Base_ptr *)
                         &(pTVar29->
                          super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                          ).second.newBinding;
          local_598 = *(_Base_ptr *)
                       &(pTVar29->
                        super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                        ).second.newLocation;
          pTStack_590 = *(TIntermediate **)
                         &(pTVar29->
                          super_pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                          ).second.newIndex;
          this_00 = &uniformResolve.uniformVarMap[lVar23]->_M_t;
          iVar16 = (*(pTStack_5b0->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])();
          iVar21 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
                   ::find(this_00,(key_type *)CONCAT44(extraout_var,iVar16));
          if (((_Rb_tree_header *)iVar21._M_node !=
               &(uniformResolve.uniformVarMap[lVar23]->_M_t)._M_impl.super__Rb_tree_header) &&
             (iVar21._M_node[2]._M_parent == local_5b8)) {
            if (local_5a8._4_4_ == 0) {
              _Var1 = iVar21._M_node[3]._M_color;
              iVar21._M_node[3]._M_parent = local_598;
              iVar21._M_node[3]._M_left = (_Base_ptr)pTStack_590;
              iVar21._M_node[2]._M_right = local_5a8;
              *(_Base_ptr *)(iVar21._M_node + 3) = p_Stack_5a0;
              iVar21._M_node[2]._M_parent = local_5b8;
              iVar21._M_node[2]._M_left = (_Base_ptr)pTStack_5b0;
              if (0 < (int)_Var1) {
                iVar21._M_node[3]._M_color = _Var1;
              }
            }
            else {
              *(int *)((long)&iVar21._M_node[2]._M_right + 4) = local_5a8._4_4_;
            }
          }
        }
        pTVar5 = this->intermediates[lVar23];
        pTVar2 = this->inVarMaps[lVar23];
        pTVar6 = this->outVarMaps[lVar23];
        pTVar7 = uniformResolve.uniformVarMap[lVar23];
        _size = &PTR__TIntermTraverser_00b096d8;
        local_5d8 = 0x101;
        local_5b8 = (_Base_ptr)0x0;
        pTStack_5b0 = (TIntermSymbol *)0x0;
        local_5c8._M_allocated_capacity = 0;
        local_5c8._8_8_ = 0;
        uStack_5d6 = 0;
        uStack_5d0 = 0;
        local_5ce = 0;
        local_5c8._M_allocated_capacity = (size_type)GetThreadPoolAllocator();
        local_5c8._8_8_ = 0;
        local_5b8 = (_Base_ptr)0x0;
        pTStack_5b0 = (TIntermSymbol *)0x0;
        local_598 = (_Base_ptr)0x0;
        local_588._0_8_ = local_560 + 8;
        local_588._8_8_ = 1;
        local_578 = (undefined1  [16])0x0;
        local_568 = 1.0;
        local_560 = (undefined1  [16])0x0;
        local_550._0_8_ = local_528 + 8;
        local_550._8_8_ = 1;
        local_540 = (undefined1  [16])0x0;
        local_530 = 1.0;
        local_528 = (undefined1  [16])0x0;
        local_518 = 1;
        _size = &PTR__TLiveTraverser_00b0e088;
        pTVar8 = this->intermediates[lVar23]->treeRoot;
        local_5a8 = (_Base_ptr)&local_5a8;
        p_Stack_5a0 = (_Base_ptr)&local_5a8;
        pTStack_590 = pTVar5;
        local_510 = pTVar2;
        local_508 = pTVar6;
        local_500 = pTVar7;
        (*pTVar8->_vptr_TIntermNode[2])(pTVar8,&size);
        _size = &PTR__TLiveTraverser_00b09898;
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_550);
        std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       *)local_588);
        p_Var17 = local_5a8;
        while (p_Var17 != (_Base_ptr)&local_5a8) {
          p_Var9 = *(_Base_ptr *)p_Var17;
          operator_delete(p_Var17,0x18);
          p_Var17 = p_Var9;
        }
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0xe);
    bVar15 = *hadError;
    if (uniformVector.
        super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(uniformVector.
                      super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)uniformVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)uniformVector.
                            super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar24 = bVar15 ^ 1;
    lVar23 = 0x150;
    do {
      pvVar10 = *(void **)((long)uniformResolve.uniformVarMap + lVar23 + 0x58);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,*(long *)((long)uniformResolve.uniformVarMap + lVar23 + 0x68) -
                                (long)pvVar10);
      }
      lVar23 = lVar23 + -0x18;
    } while (lVar23 != 0);
    lVar23 = 0x150;
    do {
      pvVar10 = *(void **)((long)&outVectors[0xd].
                                  super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar23);
      if (pvVar10 != (void *)0x0) {
        operator_delete(pvVar10,*(long *)((long)&outVectors[0xd].
                                                 super__Vector_base<glslang::TVarLivePair,_std::allocator<glslang::TVarLivePair>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                         + lVar23) - (long)pvVar10);
      }
      lVar23 = lVar23 + -0x18;
    } while (lVar23 != 0);
  }
  else {
    bVar24 = 0;
  }
  return (bool)bVar24;
}

Assistant:

bool TGlslIoMapper::doMap(TIoMapResolver* resolver, TInfoSink& infoSink) {
    resolver->endResolve(EShLangCount);
    if (!hadError) {
        //Resolve uniform location, ubo/ssbo/opaque bindings across stages
        TResolverUniformAdaptor uniformResolve(EShLangCount, *resolver, uniformVarMap, infoSink, hadError);
        TResolverInOutAdaptor inOutResolve(EShLangCount, *resolver, infoSink, hadError);
        TSymbolValidater symbolValidater(*resolver, infoSink, inVarMaps,
                                         outVarMaps, uniformVarMap, hadError, profile, version);

        TVarLiveVector inVectors[EShLangCount];
        TVarLiveVector outVectors[EShLangCount];
        TVarLiveVector uniformVector;

        resolver->beginResolve(EShLangCount);
        for (int stage = EShLangVertex; stage < EShLangCount; stage++) {
            if (inVarMaps[stage] != nullptr) {
                inOutResolve.setStage(EShLanguage(stage));

                // copy vars into a sorted list
                std::for_each(inVarMaps[stage]->begin(), inVarMaps[stage]->end(),
                        [&inVectors, stage](TVarLivePair p) { inVectors[stage].push_back(p); });
                std::sort(inVectors[stage].begin(), inVectors[stage].end(),
                        [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
                            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
                });

                std::for_each(outVarMaps[stage]->begin(), outVarMaps[stage]->end(),
                        [&outVectors, stage](TVarLivePair p) { outVectors[stage].push_back(p); });
                std::sort(outVectors[stage].begin(), outVectors[stage].end(),
                        [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
                            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
                });

                for (auto& var : inVectors[stage]) { symbolValidater(var); }
                for (auto& var : inVectors[stage]) { inOutResolve(var); }
                for (auto& var : outVectors[stage]) { symbolValidater(var); }
                for (auto& var : outVectors[stage]) { inOutResolve(var); }

                // copy results back into maps
                std::for_each(inVectors[stage].begin(), inVectors[stage].end(),
                    [this, stage](TVarLivePair p) {
                        auto at = inVarMaps[stage]->find(p.first);
                        if (at != inVarMaps[stage]->end())
                            at->second = p.second;
                });

                std::for_each(outVectors[stage].begin(), outVectors[stage].end(),
                    [this, stage](TVarLivePair p) {
                        auto at = outVarMaps[stage]->find(p.first);
                        if (at != outVarMaps[stage]->end())
                            at->second = p.second;
                });

            }
            if (uniformVarMap[stage] != nullptr) {
                uniformResolve.setStage(EShLanguage(stage));
                for (auto& var : *(uniformVarMap[stage])) { uniformVector.push_back(var); }
            }
        }
        std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
            return TVarEntryInfo::TOrderByPriorityAndLive()(p1.second, p2.second);
        });
        for (auto& var : uniformVector) { symbolValidater(var); }
        for (auto& var : uniformVector) { uniformResolve(var); }
        std::sort(uniformVector.begin(), uniformVector.end(), [](const TVarLivePair& p1, const TVarLivePair& p2) -> bool {
            return TVarEntryInfo::TOrderByPriority()(p1.second, p2.second);
        });
        resolver->endResolve(EShLangCount);
        if (autoPushConstantBlockName.length()) {
            bool upgraded = false;
            for (size_t stage = 0; stage < EShLangCount; stage++) {
                if (intermediates[stage] != nullptr) {
                    TVarLiveMap** pUniformVarMap = uniformResolve.uniformVarMap;
                    auto at = pUniformVarMap[stage]->find(autoPushConstantBlockName);
                    if (at == pUniformVarMap[stage]->end())
                        continue;
                    TQualifier& qualifier = at->second.symbol->getQualifier();
                    if (!qualifier.isUniform())
                        continue;
                    TType& t = at->second.symbol->getWritableType();
                    int size, stride;
                    TIntermediate::getBaseAlignment(t, size, stride, autoPushConstantBlockPacking,
                                                    qualifier.layoutMatrix == ElmRowMajor);
                    if (size <= int(autoPushConstantMaxSize)) {
                        qualifier.setBlockStorage(EbsPushConstant);
                        qualifier.layoutPacking = autoPushConstantBlockPacking;
                        // Push constants don't have set/binding etc. decorations, remove those.
                        qualifier.layoutSet = TQualifier::layoutSetEnd;
                        at->second.clearNewAssignments();

                        upgraded = true;
                    }
                }
            }
            // If it's been upgraded to push_constant, then set the flag so when its traversed
            // in the next for loop, all references to this symbol will get their flag changed.
            // so it doesn't get a set/binding assigned to it.
            if (upgraded) {
                std::for_each(uniformVector.begin(), uniformVector.end(),
                                       [this](TVarLivePair& p) {
                if (p.first == autoPushConstantBlockName) {
                        p.second.upgradedToPushConstantPacking = autoPushConstantBlockPacking;
                        p.second.newSet = TQualifier::layoutSetEnd;
                    }
                });
            }
        }
        for (size_t stage = 0; stage < EShLangCount; stage++) {
            if (intermediates[stage] != nullptr) {
                // traverse each stage, set new location to each input/output and unifom symbol, set new binding to
                // ubo, ssbo and opaque symbols. Assign push_constant upgrades as well.
                TVarLiveMap** pUniformVarMap = uniformResolve.uniformVarMap;
                std::for_each(uniformVector.begin(), uniformVector.end(), [pUniformVarMap, stage](TVarLivePair p) {
                    auto at = pUniformVarMap[stage]->find(p.second.symbol->getAccessName());
                    if (at != pUniformVarMap[stage]->end() && at->second.id == p.second.id){
                        if (p.second.upgradedToPushConstantPacking != ElpNone) {
                            at->second.upgradedToPushConstantPacking = p.second.upgradedToPushConstantPacking;
                        } else {
                            int resolvedBinding = at->second.newBinding;
                            at->second = p.second;
                            if (resolvedBinding > 0)
                                at->second.newBinding = resolvedBinding;
                        }
                    }
                });
                TVarSetTraverser iter_iomap(*intermediates[stage], *inVarMaps[stage], *outVarMaps[stage],
                                            *uniformResolve.uniformVarMap[stage]);
                intermediates[stage]->getTreeRoot()->traverse(&iter_iomap);
            }
        }
        return !hadError;
    } else {
        return false;
    }
}